

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O2

optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
::find(optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>
       *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void,_supermap::Key<1UL>_>
      *this,Key<1UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
            *equal)

{
  _Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>> *p_Var1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> firstLeqElem;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> KStack_58;
  _Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>> *local_48;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
  *local_40;
  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
  *local_38;
  
  local_40 = equal;
  local_38 = less;
  iVar5 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
            ._vptr_OrderedStorage[1])(this);
  if (iVar5 != 0) {
    local_48 = (_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
                *)__return_storage_ptr__;
    uVar6 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              ._vptr_OrderedStorage[1])(this);
    uVar7 = 0;
    while (1 < uVar6 - uVar7) {
      uVar8 = uVar7 + uVar6 >> 1;
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        ._vptr_OrderedStorage[4])(&KStack_58,this,(ulong)uVar8);
      bVar4 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
              ::operator()(local_38,&KStack_58,pattern);
      uVar2 = uVar6;
      uVar3 = uVar8;
      if ((!bVar4) &&
         (bVar4 = std::
                  function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
                  ::operator()(local_40,&KStack_58,pattern), uVar2 = uVar8, uVar3 = uVar7, bVar4)) {
        uVar2 = uVar6;
        uVar3 = uVar8;
      }
      uVar7 = uVar3;
      uVar6 = uVar2;
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&KStack_58.value.data_);
    }
    uVar6 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
              ._vptr_OrderedStorage[1])(this);
    __return_storage_ptr__ =
         (optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *)local_48;
    if (uVar7 < uVar6) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_unsigned_int,_void>
        ._vptr_OrderedStorage[4])(&KStack_58,this,(ulong)uVar7);
      bVar4 = std::
              function<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_&,_const_supermap::Key<1UL>_&)>
              ::operator()(local_40,&KStack_58,pattern);
      p_Var1 = local_48;
      if (bVar4) {
        std::_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
        ::_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>&>
                  (local_48,&KStack_58);
      }
      else {
        local_48[0x10] =
             (_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
              )0x0;
      }
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                (&KStack_58.value.data_);
      return (optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *)p_Var1;
    }
  }
  *(_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>> *)
   ((long)__return_storage_ptr__ + 0x10) =
       (_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>)0x0;
  return (optional<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_> *)
         (_Optional_payload_base<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>> *)
         __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }